

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *blindout,uint64_t *value_out,uchar *message_out,size_t *outlen,uchar *nonce,
              uint64_t *min_value,uint64_t *max_value,secp256k1_ge *commit,uchar *proof,size_t plen,
              uchar *extra_commit,size_t extra_commit_len,secp256k1_ge *genp)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_00;
  uint in_EAX;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  secp256k1_scalar *psVar10;
  long lVar11;
  size_t sVar12;
  size_t rings;
  long unaff_R15;
  uint64_t value;
  uint local_634c;
  ulong local_6348;
  long local_6340;
  int overflow;
  uint64_t vv;
  uchar *local_6310;
  uint64_t *local_6308;
  uchar *local_6300;
  size_t *local_62f8;
  secp256k1_ecmult_gen_context *local_62f0;
  uchar m [33];
  secp256k1_gej accj;
  uchar signs [31];
  secp256k1_scalar blind;
  secp256k1_ge c;
  secp256k1_sha256 sha256_m;
  size_t rsizes [32];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  secp256k1_scalar evalues [128];
  
  bVar3 = true;
  if (0x40 < plen) {
    bVar1 = *proof;
    in_EAX = 0;
    if (-1 < (char)bVar1) {
      unaff_R15 = 1;
      if (bVar1 < 0x40) {
        local_634c = 0xffffffff;
        local_6348 = 1;
        uVar6 = 0;
      }
      else {
        local_634c = bVar1 & 0x1f;
        local_6348 = 1;
        if (0x12 < (byte)local_634c) {
          in_EAX = 0;
          goto LAB_00126c0b;
        }
        bVar2 = proof[1];
        in_EAX = bVar2 + 1;
        if (0x3f < bVar2) goto LAB_00126c0b;
        uVar6 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
        local_6348 = 2;
      }
      *max_value = uVar6;
      if (0 < (int)local_634c) {
        uVar6 = *max_value;
        uVar9 = local_634c;
        do {
          if (0x1999999999999999 < uVar6) goto LAB_00126c0b;
          uVar6 = uVar6 * 10;
          *max_value = uVar6;
          unaff_R15 = unaff_R15 * 10;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      *min_value = 0;
      if ((bVar1 & 0x20) != 0) {
        if (plen - local_6348 < 8) goto LAB_00126c0b;
        uVar6 = *min_value;
        lVar11 = 0;
        do {
          uVar6 = uVar6 << 8 | (ulong)proof[lVar11 + local_6348];
          *min_value = uVar6;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        local_6348 = local_6348 | 8;
      }
      if (!CARRY8(*max_value,*min_value)) {
        *max_value = *max_value + *min_value;
        bVar3 = false;
      }
      goto LAB_00126c0b;
    }
  }
  local_6348 = 0;
  bVar3 = true;
LAB_00126c0b:
  if (!bVar3) {
    rsizes[0] = 1;
    if (in_EAX == 0) {
      rings = 1;
      uVar6 = 1;
    }
    else {
      rings = (size_t)((int)in_EAX >> 1);
      if (in_EAX != 1) {
        lVar11 = 0;
        do {
          rsizes[lVar11] = 4;
          lVar11 = lVar11 + 1;
        } while (rings + (rings == 0) != lVar11);
      }
      uVar6 = (ulong)(int)(in_EAX * 2 & 0xfffffffc);
      if ((in_EAX & 1) != 0) {
        rsizes[rings] = 2;
        uVar6 = uVar6 | 2;
        rings = rings + 1;
      }
    }
    uVar8 = rings + 6 >> 3;
    if ((uVar6 + rings) * 0x20 + uVar8 <= plen - local_6348) {
      sha256_m.s[0] = 0x6a09e667;
      sha256_m.s[1] = 0xbb67ae85;
      sha256_m.s[2] = 0x3c6ef372;
      sha256_m.s[3] = 0xa54ff53a;
      sha256_m.s[4] = 0x510e527f;
      sha256_m.s[5] = 0x9b05688c;
      sha256_m.s[6] = 0x1f83d9ab;
      sha256_m.s[7] = 0x5be0cd19;
      sha256_m.bytes = 0;
      s[1].d[0] = (commit->x).n[4];
      s[0].d[0] = (commit->x).n[0];
      s[0].d[1] = (commit->x).n[1];
      s[0].d[2] = (commit->x).n[2];
      s[0].d[3] = (commit->x).n[3];
      local_6310 = blindout;
      local_6308 = value_out;
      local_6300 = message_out;
      local_62f8 = outlen;
      local_62f0 = ecmult_gen_ctx;
      secp256k1_fe_normalize((secp256k1_fe *)s);
      iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&commit->y);
      m[0] = (byte)iVar4 ^ 1;
      secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
      secp256k1_sha256_write(&sha256_m,m,0x21);
      s[1].d[0] = (genp->x).n[4];
      s[0].d[0] = (genp->x).n[0];
      s[0].d[1] = (genp->x).n[1];
      s[0].d[2] = (genp->x).n[2];
      s[0].d[3] = (genp->x).n[3];
      secp256k1_fe_normalize((secp256k1_fe *)s);
      iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&genp->y);
      m[0] = (byte)iVar4 ^ 1;
      secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
      secp256k1_sha256_write(&sha256_m,m,0x21);
      secp256k1_sha256_write(&sha256_m,proof,local_6348);
      uVar6 = rings - 1;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          signs[uVar7] = (proof[(uVar7 >> 3) + local_6348] >> ((uint)uVar7 & 7) & 1) != 0;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      local_6340 = uVar8 + local_6348;
      if (((uVar6 & 7) == 0) || (proof[local_6340 + -1] >> (sbyte)(uVar6 & 7) == 0)) {
        accj.infinity = 1;
        accj.x.n[0] = 0;
        accj.x.n[1] = 0;
        accj.x.n[2] = 0;
        accj.x.n[3] = 0;
        accj.x.n[4] = 0;
        accj.y.n[0] = 0;
        accj.y.n[1] = 0;
        accj.y.n[2] = 0;
        accj.y.n[3] = 0;
        accj.y.n[4] = 0;
        accj.z.n[0] = 0;
        accj.z.n[1] = 0;
        accj.z.n[2] = 0;
        accj.z.n[3] = 0;
        accj.z.n[4] = 0;
        if (*min_value != 0) {
          secp256k1_pedersen_ecmult_small(&accj,*min_value,genp);
        }
        lVar11 = 0;
        if (uVar6 != 0) {
          uVar8 = 0;
          lVar11 = 0;
          do {
            iVar4 = secp256k1_fe_set_b32((secp256k1_fe *)s,proof + local_6340);
            if ((iVar4 == 0) || (iVar4 = secp256k1_ge_set_xquad(&c,(secp256k1_fe *)s), iVar4 == 0))
            {
              bVar3 = false;
            }
            else {
              if (signs[uVar8] != '\0') {
                secp256k1_ge_neg(&c,&c);
              }
              secp256k1_sha256_write(&sha256_m,signs + uVar8,1);
              secp256k1_sha256_write(&sha256_m,proof + local_6340,0x20);
              pubs[lVar11].infinity = c.infinity;
              pubs[lVar11].x.n[0] = c.x.n[0];
              pubs[lVar11].x.n[1] = c.x.n[1];
              pubs[lVar11].x.n[2] = c.x.n[2];
              pubs[lVar11].x.n[3] = c.x.n[3];
              pubs[lVar11].x.n[4] = c.x.n[4];
              pubs[lVar11].y.n[0] = c.y.n[0];
              pubs[lVar11].y.n[1] = c.y.n[1];
              pubs[lVar11].y.n[2] = c.y.n[2];
              pubs[lVar11].y.n[3] = c.y.n[3];
              pubs[lVar11].y.n[4] = c.y.n[4];
              pubs[lVar11].z.n[0] = 1;
              pubs[lVar11].z.n[3] = 0;
              pubs[lVar11].z.n[4] = 0;
              pubs[lVar11].z.n[1] = 0;
              pubs[lVar11].z.n[2] = 0;
              secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
              local_6340 = local_6340 + 0x20;
              lVar11 = lVar11 + rsizes[uVar8];
              bVar3 = true;
            }
            if (!bVar3) {
              return 0;
            }
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        secp256k1_gej_neg(&accj,&accj);
        secp256k1_gej_add_ge_var(pubs + lVar11,&accj,commit,(secp256k1_fe *)0x0);
        if (pubs[lVar11].infinity == 0) {
          secp256k1_rangeproof_pub_expand(pubs,local_634c,rsizes,rings,genp);
          sVar12 = local_6340 + 0x20;
          lVar11 = lVar11 + rsizes[rings - 1];
          if (lVar11 != 0) {
            psVar10 = s;
            do {
              secp256k1_scalar_set_b32(psVar10,proof + sVar12,&overflow);
              if (overflow != 0) {
                return 0;
              }
              sVar12 = sVar12 + 0x20;
              psVar10 = psVar10 + 1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          if (sVar12 == plen) {
            if (extra_commit != (uchar *)0x0) {
              secp256k1_sha256_write(&sha256_m,extra_commit,extra_commit_len);
            }
            secp256k1_sha256_finalize(&sha256_m,m);
            psVar10 = evalues;
            if (nonce == (uchar *)0x0) {
              psVar10 = (secp256k1_scalar *)0x0;
            }
            iVar4 = secp256k1_borromean_verify
                              (ecmult_ctx,psVar10,proof + local_6340,s,pubs,rsizes,rings,m,0x20);
            ecmult_gen_ctx_00 = local_62f0;
            if (nonce == (uchar *)0x0) {
              return iVar4;
            }
            if (iVar4 == 0) {
              return 0;
            }
            if ((local_62f0 != (secp256k1_ecmult_gen_context *)0x0) &&
               (iVar5 = secp256k1_rangeproof_rewind_inner
                                  (&blind,&vv,local_6300,local_62f8,evalues,s,rsizes,rings,nonce,
                                   commit,proof,local_6348,genp), iVar5 != 0)) {
              value = unaff_R15 * vv + *min_value;
              vv = value;
              secp256k1_pedersen_ecmult(ecmult_gen_ctx_00,&accj,&blind,value,genp);
              if (accj.infinity == 0) {
                secp256k1_gej_neg(&accj,&accj);
                secp256k1_gej_add_ge_var(&accj,&accj,commit,(secp256k1_fe *)0x0);
                if (accj.infinity != 0) {
                  if (local_6310 != (uchar *)0x0) {
                    secp256k1_scalar_get_b32(local_6310,&blind);
                  }
                  if (local_6308 == (uint64_t *)0x0) {
                    return iVar4;
                  }
                  *local_6308 = value;
                  return iVar4;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_context* ecmult_ctx,
 const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_pedersen_ecmult_small(&accj, *min_value, genp);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(ecmult_ctx, nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(ecmult_gen_ctx, &accj, &blind, vv, genp);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}